

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall QWhatsThat::~QWhatsThat(QWhatsThat *this)

{
  undefined8 *in_RDI;
  QWidget *in_stack_00000078;
  
  *in_RDI = &PTR_metaObject_00d0d930;
  in_RDI[2] = &PTR__QWhatsThat_00d0dae0;
  instance = (QWhatsThat *)0x0;
  if ((in_RDI[0xb] != 0) && ((long *)in_RDI[0xb] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[0xb] + 0x20))();
  }
  QString::~QString((QString *)0x4c2f76);
  QString::~QString((QString *)0x4c2f84);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x4c2f92);
  QWidget::~QWidget(in_stack_00000078);
  return;
}

Assistant:

QWhatsThat::~QWhatsThat()
{
    instance = nullptr;
    if (doc)
        delete doc;
}